

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProperties.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderPropertiesProgramObject::iterate
          (TessellationShaderPropertiesProgramObject *this)

{
  _test_descriptor *value;
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  TestError *pTVar6;
  NotSupportedError *this_00;
  GLenum *value_00;
  GLint gen_point_mode_value;
  GLint gen_vertex_order_value;
  GLint gen_spacing_value;
  GLint gen_mode_value;
  GLint control_output_vertices_value;
  GLint link_status;
  GLint te_compile_status;
  GLint tc_compile_status;
  _tests tests;
  value_type local_250;
  value_type local_228;
  value_type local_200;
  value_type local_1d8;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping",
               (allocator<char> *)&local_1d8);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  local_1d8.expected_control_output_vertices_value = 4;
  local_228.expected_gen_mode_value = (this->super_TestCaseBase).m_glExtTokens.QUADS;
  local_1d8.expected_gen_point_mode_value = 0;
  local_1d8.expected_gen_spacing_value = 0x202;
  local_1d8.expected_gen_vertex_order_value = 0x901;
  local_1d8.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices=4) out;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
  ;
  local_1d8.te_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(quads) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  local_250.expected_control_output_vertices_value = 0x10;
  local_250.expected_gen_mode_value = (this->super_TestCaseBase).m_glExtTokens.ISOLINES;
  local_250.expected_gen_point_mode_value = 0;
  local_250.expected_gen_spacing_value = (this->super_TestCaseBase).m_glExtTokens.FRACTIONAL_EVEN;
  local_250.expected_gen_vertex_order_value = 0x900;
  local_250.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices=16) out;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
  ;
  local_250.te_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(isolines, fractional_even_spacing, cw) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  local_200.expected_control_output_vertices_value = 0x20;
  local_200.expected_gen_mode_value = 4;
  local_200.expected_gen_point_mode_value = 1;
  local_200.expected_gen_spacing_value = (this->super_TestCaseBase).m_glExtTokens.FRACTIONAL_ODD;
  local_200.expected_gen_vertex_order_value = 0x901;
  local_200.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices=32) out;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
  ;
  local_200.te_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(triangles, fractional_odd_spacing, ccw, point_mode) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  local_228.expected_control_output_vertices_value = 8;
  local_228.expected_gen_point_mode_value = 1;
  local_228.expected_gen_spacing_value = 0x202;
  local_228.expected_gen_vertex_order_value = 0x901;
  local_228.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices=8) out;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
  ;
  local_228.te_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(quads, equal_spacing, ccw, point_mode) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  tests.
  super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tests.
  super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tests.
  super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.expected_gen_mode_value = local_228.expected_gen_mode_value;
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::push_back(&tests,&local_1d8);
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::push_back(&tests,&local_250);
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::push_back(&tests,&local_200);
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::push_back(&tests,&local_228);
  value_00 = &(tests.
               super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start)->expected_gen_vertex_order_value;
  while( true ) {
    value = (_test_descriptor *)(value_00 + -4);
    if (value == tests.
                 super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      std::
      _Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
      ::~_Vector_base(&tests.
                       super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
                     );
      return STOP;
    }
    TestCaseBase::shaderSourceSpecialized
              (&this->super_TestCaseBase,this->m_tc_id,1,(GLchar **)(value_00 + 2));
    TestCaseBase::shaderSourceSpecialized
              (&this->super_TestCaseBase,this->m_te_id,1,(GLchar **)(value_00 + 4));
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glShaderSource() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x19e);
    (**(code **)(lVar4 + 0x248))(this->m_tc_id);
    (**(code **)(lVar4 + 0x248))(this->m_te_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glCompileShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1a4);
    tc_compile_status = 0;
    te_compile_status = 0;
    (**(code **)(lVar4 + 0xa70))(this->m_tc_id,0x8b81,&tc_compile_status);
    (**(code **)(lVar4 + 0xa70))(this->m_te_id,0x8b81,&te_compile_status);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1ad);
    if (tc_compile_status != 1) break;
    if (te_compile_status != 1) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Could not compile tessellation evaluation shader",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1b6);
      goto LAB_00d14ba4;
    }
    link_status = 0;
    (**(code **)(lVar4 + 0xce8))(this->m_po_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glLinkProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1bd);
    (**(code **)(lVar4 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1c0);
    if (link_status != 1) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1c4);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    control_output_vertices_value = 0;
    gen_mode_value = 0;
    gen_spacing_value = 0;
    gen_vertex_order_value = 0;
    gen_point_mode_value = 0;
    (**(code **)(lVar4 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_OUTPUT_VERTICES,
               &control_output_vertices_value);
    (**(code **)(lVar4 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_MODE,&gen_mode_value)
    ;
    (**(code **)(lVar4 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_SPACING,
               &gen_spacing_value);
    (**(code **)(lVar4 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_POINT_MODE,
               &gen_point_mode_value);
    (**(code **)(lVar4 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_VERTEX_ORDER,
               &gen_vertex_order_value);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() for tessellation-specific properties failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1d4);
    if (control_output_vertices_value != value->expected_control_output_vertices_value) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property; ");
      std::operator<<((ostream *)poVar1," expected: ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)value);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", retrieved: ");
      std::ostream::operator<<(&pMVar5->m_str,control_output_vertices_value);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1dd);
LAB_00d14f79:
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (gen_mode_value != value_00[-3]) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Invalid value reported for GL_TESS_GEN_MODE_EXT property; "
                     );
      std::operator<<((ostream *)poVar1," expected: ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00 + -3);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", retrieved: ");
      std::ostream::operator<<(&pMVar5->m_str,gen_mode_value);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid value reported for GL_TESS_GEN_MODE_EXT property.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1e6);
      goto LAB_00d14f79;
    }
    if (gen_spacing_value != value_00[-1]) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Invalid value reported for GL_TESS_GEN_SPACING_EXT property; ");
      std::operator<<((ostream *)poVar1," expected: ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00 + -1);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", retrieved: ");
      std::ostream::operator<<(&pMVar5->m_str,gen_spacing_value);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid value reported for GL_TESS_GEN_SPACING_EXT property.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1f0);
      goto LAB_00d14f79;
    }
    if (gen_point_mode_value != value_00[-2]) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property; ");
      std::operator<<((ostream *)poVar1," expected: ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00 + -2);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", retrieved: ");
      std::ostream::operator<<(&pMVar5->m_str,gen_point_mode_value);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1fa);
      goto LAB_00d14f79;
    }
    if (gen_vertex_order_value != *value_00) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property; ");
      std::operator<<((ostream *)poVar1," expected: ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", retrieved: ");
      std::ostream::operator<<(&pMVar5->m_str,gen_vertex_order_value);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x204);
      goto LAB_00d14f79;
    }
    value_00 = value_00 + 10;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Could not compile tessellation control shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
             ,0x1b1);
LAB_00d14ba4:
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPropertiesProgramObject::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	initTest();

	/* Test 1: Default values. Values as per spec, define as little qualifiers as possible */
	_test_descriptor test_1;

	test_1.expected_control_output_vertices_value = 4;
	test_1.expected_gen_mode_value				  = m_glExtTokens.QUADS;
	test_1.expected_gen_point_mode_value		  = GL_FALSE;
	test_1.expected_gen_spacing_value			  = GL_EQUAL;
	test_1.expected_gen_vertex_order_value		  = GL_CCW;
	test_1.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=4) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_1.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(quads) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 2: 16 vertices per patch + isolines + fractional_even_spacing + cw combination */
	_test_descriptor test_2;

	test_2.expected_control_output_vertices_value = 16;
	test_2.expected_gen_mode_value				  = m_glExtTokens.ISOLINES;
	test_2.expected_gen_point_mode_value		  = GL_FALSE;
	test_2.expected_gen_spacing_value			  = m_glExtTokens.FRACTIONAL_EVEN;
	test_2.expected_gen_vertex_order_value		  = GL_CW;
	test_2.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=16) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_2.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(isolines, fractional_even_spacing, cw) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 3: 32 vertices per patch + triangles + fractional_odd_spacing + ccw combination + point mode*/
	_test_descriptor test_3;

	test_3.expected_control_output_vertices_value = 32;
	test_3.expected_gen_mode_value				  = GL_TRIANGLES;
	test_3.expected_gen_point_mode_value		  = GL_TRUE;
	test_3.expected_gen_spacing_value			  = m_glExtTokens.FRACTIONAL_ODD;
	test_3.expected_gen_vertex_order_value		  = GL_CCW;
	test_3.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=32) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_3.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(triangles, fractional_odd_spacing, ccw, point_mode) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 4: 8 vertices per patch + quads + equal_spacing + ccw combination + point mode*/
	_test_descriptor test_4;

	test_4.expected_control_output_vertices_value = 8;
	test_4.expected_gen_mode_value				  = m_glExtTokens.QUADS;
	test_4.expected_gen_point_mode_value		  = GL_TRUE;
	test_4.expected_gen_spacing_value			  = GL_EQUAL;
	test_4.expected_gen_vertex_order_value		  = GL_CCW;
	test_4.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=8) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_4.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(quads, equal_spacing, ccw, point_mode) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Store all tests in a single vector */
	_tests tests;

	tests.push_back(test_1);
	tests.push_back(test_2);
	tests.push_back(test_3);
	tests.push_back(test_4);

	/* Iterate through all the tests and verify the values reported */
	for (_tests_const_iterator test_iterator = tests.begin(); test_iterator != tests.end(); test_iterator++)
	{
		const _test_descriptor& test = *test_iterator;

		/* Set tessellation control & evaluation shader bodies. */
		shaderSourceSpecialized(m_tc_id, 1 /* count */, &test.tc_body);
		shaderSourceSpecialized(m_te_id, 1 /* count */, &test.te_body);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed");

		/* Compile the shaders */
		gl.compileShader(m_tc_id);
		gl.compileShader(m_te_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

		/* Make sure the shaders compiled */
		glw::GLint tc_compile_status = GL_FALSE;
		glw::GLint te_compile_status = GL_FALSE;

		gl.getShaderiv(m_tc_id, GL_COMPILE_STATUS, &tc_compile_status);
		gl.getShaderiv(m_te_id, GL_COMPILE_STATUS, &te_compile_status);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

		if (tc_compile_status != GL_TRUE)
		{
			TCU_FAIL("Could not compile tessellation control shader");
		}

		if (te_compile_status != GL_TRUE)
		{
			TCU_FAIL("Could not compile tessellation evaluation shader");
		}

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

		if (link_status != GL_TRUE)
		{
			TCU_FAIL("Program linking failed");
		}

		/* Query the tessellation properties of the program object and make sure
		 * the values reported are valid */
		glw::GLint control_output_vertices_value = 0;
		glw::GLint gen_mode_value				 = GL_NONE;
		glw::GLint gen_spacing_value			 = GL_NONE;
		glw::GLint gen_vertex_order_value		 = GL_NONE;
		glw::GLint gen_point_mode_value			 = GL_NONE;

		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_CONTROL_OUTPUT_VERTICES, &control_output_vertices_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_MODE, &gen_mode_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_SPACING, &gen_spacing_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_POINT_MODE, &gen_point_mode_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_VERTEX_ORDER, &gen_vertex_order_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() for tessellation-specific properties failed.");

		if (control_output_vertices_value != test.expected_control_output_vertices_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property; "
							   << " expected: " << test.expected_control_output_vertices_value
							   << ", retrieved: " << control_output_vertices_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property.");
		}

		if ((glw::GLuint)gen_mode_value != test.expected_gen_mode_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported for GL_TESS_GEN_MODE_EXT property; "
							   << " expected: " << test.expected_gen_mode_value << ", retrieved: " << gen_mode_value
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_MODE_EXT property.");
		}

		if ((glw::GLuint)gen_spacing_value != test.expected_gen_spacing_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_SPACING_EXT property; "
							   << " expected: " << test.expected_gen_spacing_value
							   << ", retrieved: " << gen_spacing_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_SPACING_EXT property.");
		}

		if ((glw::GLuint)gen_point_mode_value != test.expected_gen_point_mode_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property; "
							   << " expected: " << test.expected_gen_point_mode_value
							   << ", retrieved: " << gen_point_mode_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property.");
		}

		if ((glw::GLuint)gen_vertex_order_value != test.expected_gen_vertex_order_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property; "
							   << " expected: " << test.expected_gen_vertex_order_value
							   << ", retrieved: " << gen_vertex_order_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property.");
		}
	} /* for (all test descriptors) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}